

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utGenBoundingBoxesProcess.cpp
# Opt level: O3

void __thiscall
utGenBoundingBoxesProcess_executeTest_Test::TestBody
          (utGenBoundingBoxesProcess_executeTest_Test *this)

{
  GenBoundingBoxesProcess *pGVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  aiMesh *mesh;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  aiMesh *local_10;
  
  pGVar1 = (this->super_utGenBoundingBoxesProcess).mProcess;
  (*(pGVar1->super_BaseProcess)._vptr_BaseProcess[5])
            (pGVar1,(this->super_utGenBoundingBoxesProcess).mScene);
  local_10 = *((this->super_utGenBoundingBoxesProcess).mScene)->mMeshes;
  local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiMesh*>
            (local_20,"nullptr","mesh",&local_30.ptr_,&local_10);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utGenBoundingBoxesProcess.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"0","mesh->mAABB.mMin.x",(int *)&local_30,(float *)&local_10->mAABB);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utGenBoundingBoxesProcess.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"0","mesh->mAABB.mMin.y",(int *)&local_30,&(local_10->mAABB).mMin.y);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utGenBoundingBoxesProcess.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_ = local_30.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"0","mesh->mAABB.mMin.z",(int *)&local_30,&(local_10->mAABB).mMin.z);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utGenBoundingBoxesProcess.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_._0_4_ = 99;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"99","mesh->mAABB.mMax.x",(int *)&local_30,&(local_10->mAABB).mMax.x);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utGenBoundingBoxesProcess.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_._0_4_ = 99;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"99","mesh->mAABB.mMax.y",(int *)&local_30,&(local_10->mAABB).mMax.y);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utGenBoundingBoxesProcess.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_._0_4_ = 99;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"99","mesh->mAABB.mMax.z",(int *)&local_30,&(local_10->mAABB).mMax.z);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utGenBoundingBoxesProcess.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(utGenBoundingBoxesProcess, executeTest) {
    mProcess->Execute(mScene);

    aiMesh* mesh = mScene->mMeshes[0];
    EXPECT_NE(nullptr, mesh);
    EXPECT_EQ(0, mesh->mAABB.mMin.x);
    EXPECT_EQ(0, mesh->mAABB.mMin.y);
    EXPECT_EQ(0, mesh->mAABB.mMin.z);

    EXPECT_EQ(99, mesh->mAABB.mMax.x);
    EXPECT_EQ(99, mesh->mAABB.mMax.y);
    EXPECT_EQ(99, mesh->mAABB.mMax.z);
}